

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O1

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
 testing::
 ValuesIn<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>,66ul>
           (TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
            (*array) [66])

{
  TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
  *__cur;
  ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  *impl;
  _func_int **__dest;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  PVar1;
  
  impl = (ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
          *)operator_new(0x20);
  impl->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__ValuesInIteratorRangeGenerator_010c1a18;
  impl[1]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[2]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[3]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  __dest = (_func_int **)operator_new(0xc60);
  impl[1]._vptr_ParamGeneratorInterface = __dest;
  impl[3]._vptr_ParamGeneratorInterface = __dest + 0x18c;
  memcpy(__dest,::(anonymous_namespace)::kArrayHBDObmcSubpelVariance_c,0xc60);
  impl[2]._vptr_ParamGeneratorInterface = __dest + 0x18c;
  internal::
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  ::ParamGenerator((ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
                    *)array,impl);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}